

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>::
convert_abi_cxx11_(string *__return_storage_ptr__,void *this,wstring_view str)

{
  wstring local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_38,str._M_len,str._M_len + (long)this * 4,str._M_str);
  StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  ::convert(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::wstring_view>::convert(std::wstring_view str) {
    return StringMaker<std::wstring>::convert(std::wstring(str));
}